

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool checkCanImportFromRootPaths(Options *options,QString *absolutePath,QString *moduleUrlPath)

{
  bool bVar1;
  QString *this;
  long in_RDI;
  long in_FS_OFFSET;
  vector<QString,_std::allocator<QString>_> *__range1;
  QString rootPath;
  const_iterator __end1;
  const_iterator __begin1;
  undefined2 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7a;
  byte in_stack_ffffffffffffff7b;
  uint in_stack_ffffffffffffff7c;
  byte local_59;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QString *)(in_RDI + 0x200);
  local_10._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
  local_10._M_current =
       (QString *)
       std::vector<QString,_std::allocator<QString>_>::begin
                 ((vector<QString,_std::allocator<QString>_> *)this);
  std::vector<QString,_std::allocator<QString>_>::end
            ((vector<QString,_std::allocator<QString>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)this,(__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff7c,
                                                CONCAT13(in_stack_ffffffffffffff7b,
                                                         CONCAT12(in_stack_ffffffffffffff7a,
                                                                  in_stack_ffffffffffffff78)))),
        bVar1) {
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator*(&local_10);
    QString::QString(this,(QString *)
                          CONCAT44(in_stack_ffffffffffffff7c,
                                   CONCAT13(in_stack_ffffffffffffff7b,
                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                     in_stack_ffffffffffffff78))));
    operator+(this,(QString *)
                   CONCAT44(in_stack_ffffffffffffff7c,
                            CONCAT13(in_stack_ffffffffffffff7b,
                                     CONCAT12(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)))
             );
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_const_QString_&> *)
               CONCAT44(in_stack_ffffffffffffff7c,
                        CONCAT13(in_stack_ffffffffffffff7b,
                                 CONCAT12(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78))));
    in_stack_ffffffffffffff7b =
         operator==(this,(QString *)
                         CONCAT44(in_stack_ffffffffffffff7c,
                                  CONCAT13(in_stack_ffffffffffffff7b,
                                           CONCAT12(in_stack_ffffffffffffff7a,
                                                    in_stack_ffffffffffffff78))));
    QString::~QString((QString *)0x124028);
    bVar1 = (in_stack_ffffffffffffff7b & 1) != 0;
    if (bVar1) {
      local_59 = 1;
    }
    in_stack_ffffffffffffff7c = (uint)bVar1;
    QString::~QString((QString *)0x124053);
    if (in_stack_ffffffffffffff7c != 0) goto LAB_00124075;
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator++(&local_10);
  }
  local_59 = 0;
LAB_00124075:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_59 & 1);
}

Assistant:

bool checkCanImportFromRootPaths(const Options *options, const QString &absolutePath,
                                 const QString &moduleUrlPath)
{
    for (auto rootPath : options->rootPaths) {
        if ((rootPath + moduleUrlPath) == absolutePath)
            return true;
    }
    return false;
}